

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parsedoffset.cc
# Opt level: O2

void walk(size_t stream_number,QPDFObjectHandle *obj,
         vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *result)

{
  char cVar1;
  qpdf_offset_t offset;
  undefined8 uVar2;
  pointer pvVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [2];
  QPDFObjectHandle local_a8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_98;
  QPDFObjectHandle item;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  offset = QPDFObjectHandle::getParsedOffset();
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)obj);
  make_objdesc_abi_cxx11_((string *)local_d8,offset,(QPDFObjectHandle *)&local_78);
  p.second._M_dataplus._M_p = (pointer)&p.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ == local_c8) {
    p.second.field_2._8_8_ = local_c8[0]._8_8_;
  }
  else {
    p.second._M_dataplus._M_p = (pointer)local_d8._0_8_;
  }
  p.second._M_string_length = local_d8._8_8_;
  local_d8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_c8[0]._M_local_buf[0] = '\0';
  local_d8._0_8_ = local_c8;
  p.first = offset;
  std::__cxx11::string::~string((string *)local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  pvVar3 = (result->
           super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(result->
                     super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) <
      stream_number + 1) {
    std::
    vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::resize(result,stream_number + 1);
    pvVar3 = (result->
             super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(pvVar3 + stream_number,&p);
  cVar1 = QPDFObjectHandle::isArray();
  if (cVar1 == '\0') {
    cVar1 = QPDFObjectHandle::isDictionary();
    if (cVar1 == '\0') {
      cVar1 = QPDFObjectHandle::isStream();
      if (cVar1 != '\0') {
        QPDFObjectHandle::getDict();
        walk(stream_number,&local_a8,result);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    else {
      QPDFObjectHandle::getKeys_abi_cxx11_();
      for (uVar2 = local_c8[0]._8_8_;
          (_Rb_tree_node_base *)uVar2 != (_Rb_tree_node_base *)(local_d8 + 8);
          uVar2 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar2)) {
        QPDFObjectHandle::getKey((string *)&item);
        cVar1 = QPDFObjectHandle::isIndirect();
        if (cVar1 == '\0') {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_98,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&item);
          walk(stream_number,(QPDFObjectHandle *)&local_98,result);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&item.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d8);
    }
  }
  else {
    QPDFObjectHandle::getArrayAsVector();
    uVar2 = local_d8._8_8_;
    for (paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._0_8_;
        paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar2; paVar4 = paVar4 + 1) {
      cVar1 = QPDFObjectHandle::isIndirect();
      if (cVar1 == '\0') {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)paVar4);
        walk(stream_number,(QPDFObjectHandle *)&local_40,result);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_d8);
  }
  std::__cxx11::string::~string((string *)&p.second);
  return;
}

Assistant:

void
walk(
    size_t stream_number,
    QPDFObjectHandle obj,
    std::vector<std::vector<std::pair<qpdf_offset_t, std::string>>>& result)
{
    qpdf_offset_t offset = obj.getParsedOffset();
    std::pair<qpdf_offset_t, std::string> p = std::make_pair(offset, make_objdesc(offset, obj));

    if (result.size() < stream_number + 1) {
        result.resize(stream_number + 1);
    }
    result[stream_number].push_back(p);

    if (obj.isArray()) {
        for (auto& oh: obj.getArrayAsVector()) {
            if (!oh.isIndirect()) {
                // QPDF::GetAllObjects() enumerates all indirect objects.
                // So only the direct objects are recursed here.
                walk(stream_number, oh, result);
            }
        }
    } else if (obj.isDictionary()) {
        for (auto const& key: obj.getKeys()) {
            QPDFObjectHandle item = obj.getKey(key);
            if (!item.isIndirect()) {
                // QPDF::GetAllObjects() enumerates all indirect objects.
                // So only the direct objects are recursed here.
                walk(stream_number, item, result);
            }
        }
    } else if (obj.isStream()) {
        walk(stream_number, obj.getDict(), result);
    }
}